

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O3

string * __thiscall
flatbuffers::FlatCompiler::GetUsageString
          (string *__return_storage_ptr__,FlatCompiler *this,string *program_name)

{
  ostream *poVar1;
  long *plVar2;
  size_t in_RCX;
  size_type *start_col;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  size_t max_col;
  size_t extraout_RDX_01;
  long lVar3;
  undefined1 auVar4 [16];
  string files_description;
  stringstream ss;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(program_name->_M_dataplus)._M_p,program_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," [OPTION]... FILE... [-- BINARY_FILE...]\n",0x29);
  auVar4._8_8_ = extraout_RDX;
  auVar4._0_8_ = language_options._24_8_;
  if (language_options._24_8_ != 0x3eeff8) {
    do {
      AppendOption((stringstream *)local_1b8,(FlatCOption *)(auVar4._0_8_ + 1),auVar4._8_8_,in_RCX);
      auVar4 = std::_Rb_tree_increment(auVar4._0_8_);
    } while (auVar4._0_8_ != language_options + 8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  lVar3 = 0;
  max_col = extraout_RDX_00;
  do {
    AppendOption((stringstream *)local_1b8,(FlatCOption *)((long)&flatc_options + lVar3),max_col,
                 in_RCX);
    lVar3 = lVar3 + 0x80;
    max_col = extraout_RDX_01;
  } while (lVar3 != 0x2d00);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  std::operator+(&local_1d8,
                 "FILEs may be schemas (must end in .fbs), binary schemas (must end in .bfbs) or JSON files (conforming to preceding schema). BINARY_FILEs after the -- must be binary flatbuffer format files. Output files are named using the base file name of the input, and written to the current directory or the path given by -o. example: "
                 ,program_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  start_col = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)start_col) {
    local_1f8.field_2._M_allocated_capacity = *start_col;
    local_1f8.field_2._8_8_ = plVar2[3];
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *start_col;
    local_1f8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_1f8._M_string_length = plVar2[1];
  *plVar2 = (long)start_col;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  AppendTextWrappedString((stringstream *)local_1b8,&local_1f8,0,(size_t)start_col);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FlatCompiler::GetUsageString(
    const std::string &program_name) const {
  std::stringstream ss;
  ss << "Usage: " << program_name
     << " [OPTION]... FILE... [-- BINARY_FILE...]\n";

  for (const FlatCOption &option : language_options) {
    AppendOption(ss, option, 80, 25);
  }
  ss << "\n";

  for (const FlatCOption &option : flatc_options) {
    AppendOption(ss, option, 80, 25);
  }
  ss << "\n";

  std::string files_description =
      "FILEs may be schemas (must end in .fbs), binary schemas (must end in "
      ".bfbs) or JSON files (conforming to preceding schema). BINARY_FILEs "
      "after the -- must be binary flatbuffer format files. Output files are "
      "named using the base file name of the input, and written to the current "
      "directory or the path given by -o. example: " +
      program_name + " -c -b schema1.fbs schema2.fbs data.json";
  AppendTextWrappedString(ss, files_description, 80, 0);
  ss << "\n";
  return ss.str();
}